

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-3.c
# Opt level: O3

_Bool GenerateSequence(FILE *out,int startInd,int len,char *output)

{
  _Bool _Var1;
  int iVar2;
  
  if (len < 1) {
    _Var1 = true;
  }
  else {
    iVar2 = -0x1a;
    do {
      output[startInd] = (char)iVar2 + '{';
      _Var1 = GenerateSequence(out,startInd + 1,len + -1,output);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0);
  }
  if ((len == 0) && (iVar2 = fprintf((FILE *)out,"%s\n",output), iVar2 < 0)) {
    puts("can\'t create in.txt. No space on disk?");
    fclose((FILE *)out);
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool GenerateSequence(FILE *out, int startInd, int len, char *output) {
    bool res = true;
    if (len > 0) {
        for (int i = 0; i < ALPHABET_SIZE; i++) {
            output[startInd] = 'a' + i;
            res = GenerateSequence(out, startInd + 1, len - 1, output);
        }
    }
    if (len == 0) {
        if (fprintf(out, "%s\n", output) < 0) {
            printf("can't create in.txt. No space on disk?\n");
            fclose(out);
            res = false;
        }
    }
    return res;
}